

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int decode_new_session_ticket
              (ptls_t *tls,uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *nonce,
              ptls_iovec_t *ticket,uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  uint uVar1;
  st_ptls_on_extension_t *psVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ushort *puVar7;
  ulong uVar8;
  ushort uVar9;
  uint8_t *puVar10;
  ulong uVar11;
  ushort *puVar12;
  ptls_iovec_t pVar13;
  st_ptls_extension_bitmap_t bitmap;
  st_ptls_extension_bitmap_t local_38;
  
  iVar4 = 0x32;
  if (3 < (long)end - (long)src) {
    uVar1 = *(uint *)src;
    *lifetime = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (3 < ((long)end - (long)src) + -4) {
      uVar1 = *(uint *)(src + 4);
      *age_add = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      if (src + 8 != end) {
        puVar10 = src + 9;
        uVar8 = (ulong)src[8];
        if (uVar8 <= (ulong)((long)end - (long)puVar10)) {
          nonce->base = puVar10;
          nonce->len = uVar8;
          if (1 < (ulong)((long)end - (long)(puVar10 + uVar8))) {
            puVar10 = src + uVar8 + 0xb;
            uVar5 = (ulong)src[uVar8 + 9] * 0x100;
            uVar11 = (ulong)src[uVar8 + 10];
            if ((uVar5 + uVar11) - 1 < (ulong)((long)end - (long)puVar10)) {
              ticket->base = puVar10;
              ticket->len = uVar5 + uVar11;
              *max_early_data_size = 0;
              local_38.bits = 0;
              if (1 < (ulong)((long)end - (long)(puVar10 + uVar5 + uVar11))) {
                lVar6 = (uVar5 | uVar11) + uVar8;
                uVar9 = *(ushort *)(puVar10 + uVar5 + uVar11);
                uVar8 = (ulong)(ushort)(uVar9 << 8 | uVar9 >> 8);
                puVar12 = (ushort *)(src + lVar6 + 0xd);
                if (uVar8 <= (ulong)((long)end - (long)puVar12)) {
                  puVar7 = puVar12;
                  if (uVar8 != 0) {
                    puVar7 = (ushort *)(src + uVar8 + lVar6 + 0xd);
                    do {
                      if ((long)puVar7 - (long)puVar12 < 2) {
                        return 0x32;
                      }
                      uVar9 = *puVar12 << 8 | *puVar12 >> 8;
                      iVar4 = extension_bitmap_testandset(&local_38,4,uVar9);
                      if (iVar4 == 0) {
                        return 0x2f;
                      }
                      if (((long)puVar7 - (long)puVar12) - 2U < 2) {
                        return 0x32;
                      }
                      uVar3 = puVar12[1] << 8 | puVar12[1] >> 8;
                      if ((ulong)((long)puVar7 - (long)(puVar12 + 2)) < (ulong)uVar3) {
                        return 0x32;
                      }
                      psVar2 = tls->ctx->on_extension;
                      if ((psVar2 != (st_ptls_on_extension_t *)0x0) &&
                         (pVar13.len._0_2_ = uVar3, pVar13.base = (uint8_t *)(puVar12 + 2),
                         pVar13.len._2_6_ = 0, iVar4 = (*psVar2->cb)(psVar2,tls,'\x04',uVar9,pVar13)
                         , iVar4 != 0)) {
                        return 1;
                      }
                      if (uVar9 == 0x2a) {
                        if (uVar3 < 4) {
                          return 0x32;
                        }
                        uVar1 = *(uint *)(puVar12 + 2);
                        *max_early_data_size =
                             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18;
                        if (uVar3 != 4) {
                          return 0x32;
                        }
                        puVar12 = puVar12 + 4;
                      }
                      else {
                        puVar12 = (ushort *)((long)puVar12 + (ulong)uVar3 + 4);
                      }
                    } while (puVar12 != puVar7);
                  }
                  iVar4 = 0x32;
                  if (puVar7 == (ushort *)end) {
                    iVar4 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int decode_new_session_ticket(ptls_t *tls, uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *nonce, ptls_iovec_t *ticket,
                                     uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t exttype;
    int ret;

    if ((ret = ptls_decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode32(age_add, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 1, {
        *nonce = ptls_iovec_init(src, end - src);
        src = end;
    });
    ptls_decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if ((ret = ptls_decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}